

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

opj_bool j2k_read_qcc_v2(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                        opj_event_mgr *p_manager)

{
  OPJ_UINT32 p_nb_bytes;
  opj_bool oVar1;
  int iVar2;
  long lVar3;
  OPJ_UINT32 local_44;
  opj_event_mgr *local_40;
  OPJ_UINT32 l_comp_no;
  
  if (p_j2k->m_private_image->numcomps < 0x101) {
    if (p_header_size == 0) goto LAB_001de4e6;
    iVar2 = -1;
    lVar3 = 1;
    p_nb_bytes = 1;
  }
  else {
    if (p_header_size < 2) goto LAB_001de4e6;
    iVar2 = -2;
    lVar3 = 2;
    p_nb_bytes = 2;
  }
  local_40 = p_manager;
  opj_read_bytes_LE(p_header_data,&l_comp_no,p_nb_bytes);
  p_manager = local_40;
  local_44 = iVar2 + p_header_size;
  oVar1 = j2k_read_SQcd_SQcc(p_j2k,l_comp_no,p_header_data + lVar3,&local_44,local_40);
  if ((oVar1 != 0) && (local_44 == 0)) {
    return 1;
  }
LAB_001de4e6:
  opj_event_msg_v2(p_manager,1,"Error reading QCC marker\n");
  return 0;
}

Assistant:

opj_bool j2k_read_qcc_v2(	opj_j2k_v2_t *p_j2k,
							OPJ_BYTE * p_header_data,
							OPJ_UINT32 p_header_size,
							struct opj_event_mgr * p_manager)
{
	OPJ_UINT32 l_num_comp,l_comp_no;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	l_num_comp = p_j2k->m_private_image->numcomps;

	if (l_num_comp <= 256) {
		if (p_header_size < 1) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading QCC marker\n");
			return OPJ_FALSE;
		}
		opj_read_bytes(p_header_data,&l_comp_no,1);
		++p_header_data;
		--p_header_size;
	}
	else {
		if (p_header_size < 2) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading QCC marker\n");
			return OPJ_FALSE;
		}
		opj_read_bytes(p_header_data,&l_comp_no,2);
		p_header_data+=2;
		p_header_size-=2;
	}

#ifdef USE_JPWL
	if (p_j2k->m_cp.correct) {

		static OPJ_UINT32 backup_compno = 0;

		/* compno is negative or larger than the number of components!!! */
		if ((l_comp_no < 0) || (l_comp_no >= l_num_comp)) {
			opj_event_msg_v2(p_manager, EVT_ERROR,
				"JPWL: bad component number in QCC (%d out of a maximum of %d)\n",
				l_comp_no, l_num_comp);
			if (!JPWL_ASSUME) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "JPWL: giving up\n");
				return OPJ_FALSE;
			}
			/* we try to correct */
			l_comp_no = backup_compno % l_num_comp;
			opj_event_msg_v2(p_manager, EVT_WARNING, "- trying to adjust this\n"
				"- setting component number to %d\n",
				l_comp_no);
		}

		/* keep your private count of tiles */
		backup_compno++;
	};
#endif /* USE_JPWL */

	if (! j2k_read_SQcd_SQcc(p_j2k,l_comp_no,p_header_data,&p_header_size,p_manager)) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading QCC marker\n");
		return OPJ_FALSE;
	}

	if (p_header_size != 0) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading QCC marker\n");
		return OPJ_FALSE;
	}

	return OPJ_TRUE;
}